

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O3

void __thiscall
QueryDatabaseSearcherWorker<DNA>::Process
          (QueryDatabaseSearcherWorker<DNA> *this,SequenceList<DNA> *queries)

{
  _Map_pointer *this_00;
  _Elt_pointer pSVar1;
  _Elt_pointer pSVar2;
  _Map_pointer ppSVar3;
  _Elt_pointer query;
  undefined1 local_198 [8];
  HitList<DNA> hits;
  Hit<DNA> *local_138 [2];
  char *local_128;
  char local_118 [16];
  char *local_108;
  char local_f8 [16];
  deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_> local_e8;
  undefined1 auStack_98 [8];
  QueryWithHitsList<DNA> list;
  
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
                       *)auStack_98,0);
  query = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
          super__Deque_impl_data._M_start._M_cur;
  pSVar1 = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (query != pSVar1) {
    pSVar2 = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppSVar3 = (queries->super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      Search<DNA>::Query((HitList<DNA> *)local_198,(Search<DNA> *)this,query);
      if (hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
          super__Deque_impl_data._M_start._M_node !=
          (_Map_pointer)
          hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
          super__Deque_impl_data._M_map_size) {
        this_00 = &hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node;
        std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>::
        pair<std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_&,_true>
                  ((pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_> *)this_00
                   ,query,(HitList<DNA> *)local_198);
        std::
        deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>
        ::emplace_back<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>
                  ((deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>
                    *)auStack_98,
                   (pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_> *)this_00
                  );
        std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::~deque(&local_e8);
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if (local_128 != local_118) {
          operator_delete(local_128);
        }
        if (hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node != local_138) {
          operator_delete(hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
        }
      }
      std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::~deque((HitList<DNA> *)local_198);
      query = query + 1;
      if (query == pSVar2) {
        query = ppSVar3[1];
        ppSVar3 = ppSVar3 + 1;
        pSVar2 = query + 5;
      }
    } while (query != pSVar1);
  }
  if (list.
      super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      list.
      super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Enqueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)this->mWriter,
              (deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
               *)auStack_98);
  }
  std::
  deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ::~deque((deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
            *)auStack_98);
  return;
}

Assistant:

void Process( const SequenceList< A >& queries ) {
    QueryWithHitsList< A > list;

    for( auto& query : queries ) {
      auto hits = mGlobalSearch.Query( query );
      if( hits.empty() )
        continue;

      list.push_back( { query, hits } );
    }

    if( !list.empty() ) {
      mWriter.Enqueue( list );
    }
  }